

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-printers.cc
# Opt level: O0

void testing::internal::PrintCharAndCodeTo<unsigned_char,signed_char>(char c,ostream *os)

{
  CharFormat CVar1;
  ostream *poVar2;
  int value;
  long in_FS_OFFSET;
  CharFormat format;
  ostream *os_local;
  undefined1 local_30 [7];
  char c_local;
  long local_10;
  
  local_10 = *(long *)(in_FS_OFFSET + 0x28);
  std::operator<<(os,"\'");
  CVar1 = PrintAsCharLiteralTo<unsigned_char,signed_char>(c,os);
  std::operator<<(os,"\'");
  if (c != '\0') {
    poVar2 = std::operator<<(os," (");
    std::ostream::operator<<(poVar2,(int)c);
    if ((CVar1 != kHexEscape) && ((c < '\x01' || ('\t' < c)))) {
      poVar2 = std::operator<<(os,", 0x");
      String::FormatHexInt_abi_cxx11_((string *)local_30,(String *)(ulong)(byte)c,value);
      std::operator<<(poVar2,(string *)local_30);
      std::__cxx11::string::~string((string *)local_30);
    }
    std::operator<<(os,")");
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_10) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void PrintCharAndCodeTo(Char c, ostream* os) {
  // First, print c as a literal in the most readable form we can find.
  *os << ((sizeof(c) > 1) ? "L'" : "'");
  const CharFormat format = PrintAsCharLiteralTo<UnsignedChar>(c, os);
  *os << "'";

  // To aid user debugging, we also print c's code in decimal, unless
  // it's 0 (in which case c was printed as '\\0', making the code
  // obvious).
  if (c == 0)
    return;
  *os << " (" << static_cast<int>(c);

  // For more convenience, we print c's code again in hexadecimal,
  // unless c was already printed in the form '\x##' or the code is in
  // [1, 9].
  if (format == kHexEscape || (1 <= c && c <= 9)) {
    // Do nothing.
  } else {
    *os << ", 0x" << String::FormatHexInt(static_cast<UnsignedChar>(c));
  }
  *os << ")";
}